

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsAdvDiff_bnd.c
# Opt level: O1

void PrintHeader(sunrealtype reltol,sunrealtype abstol,sunrealtype umax)

{
  puts("\n2-D Advection-Diffusion Equation");
  printf("Mesh dimensions = %d X %d\n",10,5);
  printf("Total system size = %d\n",0x32);
  printf("Tolerance parameters: reltol = %g   abstol = %g\n\n",0,0x3ee4f8b588e368f1);
  printf("At t = %g      max.norm(u) =%14.6e \n",0,reltol);
  return;
}

Assistant:

static void PrintHeader(sunrealtype reltol, sunrealtype abstol, sunrealtype umax)
{
  printf("\n2-D Advection-Diffusion Equation\n");
  printf("Mesh dimensions = %d X %d\n", MX, MY);
  printf("Total system size = %d\n", NEQ);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("Tolerance parameters: reltol = %Lg   abstol = %Lg\n\n", reltol, abstol);
  printf("At t = %Lg      max.norm(u) =%14.6Le \n", T0, umax);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("Tolerance parameters: reltol = %g   abstol = %g\n\n", reltol, abstol);
  printf("At t = %g      max.norm(u) =%14.6e \n", T0, umax);
#else
  printf("Tolerance parameters: reltol = %g   abstol = %g\n\n", reltol, abstol);
  printf("At t = %g      max.norm(u) =%14.6e \n", T0, umax);
#endif

  return;
}